

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

void Abc_TruthWriteHex(FILE *pFile,word *pTruth,int nVars)

{
  int HexDigit;
  int local_28;
  int k;
  int Digit;
  int nDigits;
  int nVars_local;
  word *pTruth_local;
  FILE *pFile_local;
  
  local_28 = 0;
  while( true ) {
    if (1 << ((char)nVars - 2U & 0x1f) <= local_28) {
      return;
    }
    HexDigit = Abc_TruthGetHex(pTruth,local_28);
    if ((HexDigit < 0) || (0xf < HexDigit)) break;
    Abc_TruthWriteHexDigit(pFile,HexDigit);
    local_28 = local_28 + 1;
  }
  __assert_fail("Digit >= 0 && Digit < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDec.c"
                ,0x7c,"void Abc_TruthWriteHex(FILE *, word *, int)");
}

Assistant:

void Abc_TruthWriteHex( FILE * pFile, word * pTruth, int nVars )
{
    int nDigits, Digit, k;
    nDigits = (1 << (nVars-2));
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TruthGetHex( pTruth, k );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TruthWriteHexDigit( pFile, Digit );
    }
}